

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false>::
visit<slang::ast::MemberAccessExpression>
          (ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *this,
          MemberAccessExpression *t)

{
  bool bVar1;
  Expression *in_RSI;
  MemberAccessExpression *in_stack_00000028;
  CheckerMemberVisitor *in_stack_00000030;
  
  bVar1 = Expression::bad(in_RSI);
  if (!bVar1) {
    CheckerMemberVisitor::handle(in_stack_00000030,in_stack_00000028);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }